

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iothub_client_core_ll.c
# Opt level: O2

IOTHUB_CLIENT_RESULT
IoTHubClientCore_LL_UploadMultipleBlocksToBlobEx
          (IOTHUB_CLIENT_CORE_LL_HANDLE iotHubClientHandle,char *destinationFileName,
          IOTHUB_CLIENT_FILE_UPLOAD_GET_DATA_CALLBACK_EX getDataCallbackEx,void *context)

{
  IOTHUB_CLIENT_RESULT IVar1;
  LOGGER_LOG p_Var2;
  IOTHUB_CLIENT_LL_UPLOADTOBLOB_CONTEXT_HANDLE azureStorageClientHandle;
  int responseCode;
  _Bool isSuccess;
  char *azureBlobSasUri;
  char *uploadCorrelationId;
  
  if ((destinationFileName == (char *)0x0 || iotHubClientHandle == (IOTHUB_CLIENT_CORE_LL_HANDLE)0x0
      ) || getDataCallbackEx == (IOTHUB_CLIENT_FILE_UPLOAD_GET_DATA_CALLBACK_EX)0x0) {
    p_Var2 = xlogging_get_log_function();
    if (p_Var2 == (LOGGER_LOG)0x0) {
      IVar1 = IOTHUB_CLIENT_INVALID_ARG;
    }
    else {
      IVar1 = IOTHUB_CLIENT_INVALID_ARG;
      (*p_Var2)(AZ_LOG_ERROR,
                "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothub_client_core_ll.c"
                ,"IoTHubClientCore_LL_UploadMultipleBlocksToBlobEx",0xb62,1,
                "invalid parameters IOTHUB_CLIENT_CORE_LL_HANDLE iotHubClientHandle=%p, destinationFileName=%p, getDataCallbackEx=%p"
                ,iotHubClientHandle,destinationFileName,getDataCallbackEx);
    }
  }
  else {
    uploadCorrelationId = (char *)0x0;
    azureBlobSasUri = (char *)0x0;
    IVar1 = IoTHubClient_LL_UploadToBlob_InitializeUpload
                      (iotHubClientHandle->uploadToBlobHandle,destinationFileName,
                       &uploadCorrelationId,&azureBlobSasUri);
    if (IVar1 == IOTHUB_CLIENT_OK) {
      azureStorageClientHandle =
           IoTHubClient_LL_UploadToBlob_CreateContext
                     (iotHubClientHandle->uploadToBlobHandle,azureBlobSasUri);
      if (azureStorageClientHandle == (IOTHUB_CLIENT_LL_UPLOADTOBLOB_CONTEXT_HANDLE)0x0) {
        p_Var2 = xlogging_get_log_function();
        responseCode = 400;
        if (p_Var2 == (LOGGER_LOG)0x0) {
          isSuccess = false;
        }
        else {
          isSuccess = false;
          (*p_Var2)(AZ_LOG_ERROR,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothub_client_core_ll.c"
                    ,"IoTHubClientCore_LL_UploadMultipleBlocksToBlobEx",0xb77,1,
                    "Failed creating upload to blob context");
        }
      }
      else {
        IVar1 = IoTHubClient_LL_UploadToBlob_UploadMultipleBlocks
                          (azureStorageClientHandle,getDataCallbackEx,context);
        isSuccess = IVar1 == IOTHUB_CLIENT_OK;
        if (isSuccess) {
          responseCode = 200;
        }
        else {
          p_Var2 = xlogging_get_log_function();
          responseCode = 400;
          if (p_Var2 != (LOGGER_LOG)0x0) {
            (*p_Var2)(AZ_LOG_ERROR,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothub_client_core_ll.c"
                      ,"IoTHubClientCore_LL_UploadMultipleBlocksToBlobEx",0xb7e,1,
                      "Failed to upload multiple blocks to Azure blob");
          }
        }
        IoTHubClient_LL_UploadToBlob_DestroyContext(azureStorageClientHandle);
      }
      IVar1 = IoTHubClient_LL_UploadToBlob_NotifyCompletion
                        (iotHubClientHandle->uploadToBlobHandle,uploadCorrelationId,isSuccess,
                         responseCode,(char *)0x0);
      if (IVar1 == IOTHUB_CLIENT_OK) {
        IVar1 = (uint)(isSuccess ^ 1) * 2;
      }
      else {
        p_Var2 = xlogging_get_log_function();
        IVar1 = IOTHUB_CLIENT_ERROR;
        if (p_Var2 != (LOGGER_LOG)0x0) {
          (*p_Var2)(AZ_LOG_ERROR,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothub_client_core_ll.c"
                    ,"IoTHubClientCore_LL_UploadMultipleBlocksToBlobEx",0xb8d,1,
                    "Failed completing upload to blob.");
        }
      }
      free(uploadCorrelationId);
      free(azureBlobSasUri);
    }
    else {
      p_Var2 = xlogging_get_log_function();
      IVar1 = IOTHUB_CLIENT_ERROR;
      if (p_Var2 != (LOGGER_LOG)0x0) {
        (*p_Var2)(AZ_LOG_ERROR,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothub_client_core_ll.c"
                  ,"IoTHubClientCore_LL_UploadMultipleBlocksToBlobEx",0xb6d,1,
                  "Failed initializing upload in IoT Hub");
      }
    }
  }
  return IVar1;
}

Assistant:

IOTHUB_CLIENT_RESULT IoTHubClientCore_LL_UploadMultipleBlocksToBlobEx(IOTHUB_CLIENT_CORE_LL_HANDLE iotHubClientHandle, const char* destinationFileName, IOTHUB_CLIENT_FILE_UPLOAD_GET_DATA_CALLBACK_EX getDataCallbackEx, void* context)
{
    IOTHUB_CLIENT_RESULT result;
    if (
        (iotHubClientHandle == NULL) ||
        (destinationFileName == NULL) ||
        (getDataCallbackEx == NULL)
        )
    {
        LogError("invalid parameters IOTHUB_CLIENT_CORE_LL_HANDLE iotHubClientHandle=%p, destinationFileName=%p, getDataCallbackEx=%p", iotHubClientHandle, destinationFileName, getDataCallbackEx);
        result = IOTHUB_CLIENT_INVALID_ARG;
    }
    else
    {
        char* uploadCorrelationId = NULL;
        char* azureBlobSasUri = NULL;

        if (IoTHubClient_LL_UploadToBlob_InitializeUpload(
                iotHubClientHandle->uploadToBlobHandle, destinationFileName, &uploadCorrelationId, &azureBlobSasUri) != IOTHUB_CLIENT_OK)
        {
            LogError("Failed initializing upload in IoT Hub");
            result = IOTHUB_CLIENT_ERROR;
        }
        else
        {
            bool uploadSucceeded;
            IOTHUB_CLIENT_LL_UPLOADTOBLOB_CONTEXT_HANDLE uploadContext = IoTHubClient_LL_UploadToBlob_CreateContext(iotHubClientHandle->uploadToBlobHandle, azureBlobSasUri);

            if (uploadContext == NULL)
            {
                LogError("Failed creating upload to blob context");
                uploadSucceeded = false;
            }
            else
            {
                if (IoTHubClient_LL_UploadToBlob_UploadMultipleBlocks(uploadContext, getDataCallbackEx, context) != IOTHUB_CLIENT_OK)
                {
                    LogError("Failed to upload multiple blocks to Azure blob");
                    uploadSucceeded = false;
                }
                else
                {
                    uploadSucceeded = true;
                }

                IoTHubClient_LL_UploadToBlob_DestroyContext(uploadContext);
            }

            if (IoTHubClient_LL_UploadToBlob_NotifyCompletion(
                    iotHubClientHandle->uploadToBlobHandle, uploadCorrelationId, uploadSucceeded,
                    uploadSucceeded ? 200 : 400, NULL) != IOTHUB_CLIENT_OK)
            {
                LogError("Failed completing upload to blob.");
                result = IOTHUB_CLIENT_ERROR;
            }
            else
            {
                result = (uploadSucceeded ? IOTHUB_CLIENT_OK : IOTHUB_CLIENT_ERROR); 
            }

            free(uploadCorrelationId);
            free(azureBlobSasUri);
        }
    }

    return result;
}